

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCheatSheetTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockCheatSheet_bar_TestShell::createTest(TEST_MockCheatSheet_bar_TestShell *this)

{
  Utest *this_00;
  TEST_MockCheatSheet_bar_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCheatSheetTest.cpp"
                                  ,0x42);
  TEST_MockCheatSheet_bar_Test::TEST_MockCheatSheet_bar_Test
            ((TEST_MockCheatSheet_bar_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockCheatSheet, bar)
{
    /* Expect 2 calls on Bar. Check only one parameter */
    mock().expectNCalls(2, "Bar")
        .withParameter("param_double", 1.5)
        .ignoreOtherParameters();

    /* And the production code call */
    productionCodeBarCalls();
}